

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.cpp
# Opt level: O1

int __thiscall MeCab::Param::open(Param *this,char *__file,int __oflag,...)

{
  string *this_00;
  char cVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  size_t sVar5;
  size_t sVar6;
  long *extraout_RAX;
  long *extraout_RAX_00;
  long *extraout_RAX_01;
  long *extraout_RAX_02;
  bool bVar7;
  long *in_RCX;
  size_type *psVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  long *plVar13;
  uint uVar14;
  char *pcVar15;
  char cVar16;
  char *pcVar17;
  undefined8 *puVar18;
  ulong uVar19;
  long lVar20;
  whatlog *pwVar21;
  size_type __dnew;
  int local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  Param *local_d0;
  undefined8 *local_c8;
  long *local_c0;
  long *local_b8;
  ulong local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  undefined2 local_80;
  undefined1 local_7e;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  size_t local_58;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_50;
  char *local_48;
  ulong local_40;
  long local_38;
  
  uVar14 = (uint)__file;
  if ((int)uVar14 < 1) {
    plVar4 = (long *)std::__cxx11::string::_M_replace
                               ((ulong)&this->system_name_,0,
                                (char *)(this->system_name_)._M_string_length,0x1300da);
  }
  else {
    std::__cxx11::string::string((string *)&local_f0,(char *)*___oflag,(allocator *)&local_b8);
    std::__cxx11::string::operator=((string *)&this->system_name_,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    local_98 = &local_88;
    local_38 = 0xa2;
    local_c8 = ___oflag;
    plVar4 = (long *)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_38);
    lVar20 = local_38;
    local_88 = local_38;
    local_98 = plVar4;
    memcpy(plVar4,
           "MeCab: Yet Another Part-of-Speech and Morphological Analyzer\n\nCopyright(C) 2001-2012 Taku Kudo \nCopyright(C) 2004-2008 Nippon Telegraph and Telephone Corporation\n"
           ,0xa2);
    local_90 = lVar20;
    *(undefined1 *)((long)plVar4 + lVar20) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
    plVar13 = plVar4 + 2;
    if ((long *)*plVar4 == plVar13) {
      local_68 = *plVar13;
      lStack_60 = plVar4[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar13;
      local_78 = (long *)*plVar4;
    }
    local_70 = plVar4[1];
    *plVar4 = (long)plVar13;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_78,(ulong)(this->system_name_)._M_dataplus._M_p);
    plVar13 = plVar4 + 2;
    if ((long *)*plVar4 == plVar13) {
      local_a8 = *plVar13;
      lStack_a0 = plVar4[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar13;
      local_b8 = (long *)*plVar4;
    }
    local_b0 = plVar4[1];
    *plVar4 = (long)plVar13;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_c0 = in_RCX;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
    this_00 = &this->help_;
    psVar8 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_f0.field_2._M_allocated_capacity = *psVar8;
      local_f0.field_2._8_8_ = plVar4[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar8;
      local_f0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_f0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98);
    }
    local_88 = 0x61746a5f6e65706f;
    local_80 = 0x6b6c;
    local_90 = 10;
    local_7e = 0;
    local_98 = &local_88;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
    plVar13 = plVar4 + 2;
    if ((long *)*plVar4 == plVar13) {
      local_68 = *plVar13;
      lStack_60 = plVar4[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar13;
      local_78 = (long *)*plVar4;
    }
    local_70 = plVar4[1];
    *plVar4 = (long)plVar13;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
    plVar13 = plVar4 + 2;
    if ((long *)*plVar4 == plVar13) {
      local_a8 = *plVar13;
      lStack_a0 = plVar4[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar13;
      local_b8 = (long *)*plVar4;
    }
    local_b0 = plVar4[1];
    *plVar4 = (long)plVar13;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_b8,local_b0,0,'\x01');
    psVar8 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_f0.field_2._M_allocated_capacity = *psVar8;
      local_f0.field_2._8_8_ = plVar4[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar8;
      local_f0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_f0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->version_,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    plVar13 = local_c0;
    if (local_b8 != &local_a8) {
      operator_delete(local_b8);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98);
    }
    pcVar15 = (char *)*plVar13;
    local_d0 = this;
    if (pcVar15 == (char *)0x0) {
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      pcVar17 = pcVar15;
      plVar4 = plVar13;
      do {
        sVar5 = strlen(pcVar17);
        if ((char *)plVar4[3] == (char *)0x0) {
          uVar19 = sVar5 + 1;
        }
        else {
          sVar6 = strlen((char *)plVar4[3]);
          uVar19 = sVar5 + sVar6 + 2;
        }
        if (uVar11 < uVar19) {
          uVar11 = uVar19;
        }
        pcVar17 = (char *)plVar4[5];
        plVar4 = plVar4 + 5;
      } while (pcVar17 != (char *)0x0);
    }
    cVar16 = (char)this_00;
    if (pcVar15 != (char *)0x0) {
      lVar20 = 0;
      do {
        sVar5 = strlen(pcVar15);
        if ((char *)plVar13[lVar20 * 5 + 3] != (char *)0x0) {
          sVar6 = strlen((char *)plVar13[lVar20 * 5 + 3]);
          sVar5 = sVar5 + sVar6 + 1;
        }
        plVar4 = local_c0;
        std::__cxx11::string::append((char *)this_00);
        std::__cxx11::string::push_back(cVar16);
        std::__cxx11::string::append((char *)this_00);
        std::__cxx11::string::append((char *)this_00);
        if (plVar4[lVar20 * 5 + 3] != 0) {
          std::__cxx11::string::push_back(cVar16);
          std::__cxx11::string::append((char *)this_00);
        }
        for (; sVar5 <= uVar11; sVar5 = sVar5 + 1) {
          std::__cxx11::string::push_back(cVar16);
        }
        std::__cxx11::string::append((char *)this_00);
        std::__cxx11::string::push_back(cVar16);
        lVar20 = lVar20 + 1;
        pcVar15 = (char *)local_c0[lVar20 * 5];
        plVar13 = local_c0;
      } while (pcVar15 != (char *)0x0);
    }
    plVar4 = (long *)std::__cxx11::string::push_back(cVar16);
    pcVar15 = (char *)*plVar13;
    if (pcVar15 != (char *)0x0) {
      plVar4 = local_c0;
      plVar13 = local_c0;
      do {
        if ((char *)plVar13[2] != (char *)0x0) {
          std::__cxx11::string::string
                    ((string *)&local_f0,(char *)plVar13[2],(allocator *)&local_b8);
          set<std::__cxx11::string>(local_d0,pcVar15,&local_f0,true);
          plVar4 = extraout_RAX;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
            plVar4 = extraout_RAX_00;
          }
        }
        pcVar15 = (char *)plVar13[5];
        plVar13 = plVar13 + 5;
      } while (pcVar15 != (char *)0x0);
    }
    if (uVar14 != 1) {
      local_50 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &local_d0->rest_;
      local_f8 = 0;
      uVar11 = 1;
      puVar18 = local_c8;
      do {
        paVar12 = &local_f0.field_2;
        plVar4 = (long *)(long)(int)uVar11;
        pcVar15 = (char *)puVar18[(long)plVar4];
        if (*pcVar15 == '-') {
          cVar16 = pcVar15[1];
          if (cVar16 != '\0') {
            if (cVar16 == '-') {
              local_48 = pcVar15 + 2;
              for (lVar20 = 3; (cVar16 = pcVar15[lVar20 + -1], cVar16 != '\0' && (cVar16 != '='));
                  lVar20 = lVar20 + 1) {
              }
              plVar4 = (long *)0x1;
              puVar18 = local_c8;
              iVar3 = local_f8;
              if (lVar20 != 3) {
                pcVar17 = (char *)*local_c0;
                plVar13 = local_c0;
                if (pcVar17 == (char *)0x0) {
                  bVar7 = false;
                }
                else {
                  local_58 = lVar20 - 3;
                  bVar7 = false;
                  local_40 = uVar11;
                  do {
                    sVar5 = strlen(pcVar17);
                    if ((lVar20 - sVar5 == 3) &&
                       (iVar3 = strncmp(local_48,pcVar17,local_58), iVar3 == 0)) {
                      bVar7 = true;
                      bVar2 = false;
                    }
                    else {
                      bVar2 = true;
                    }
                    uVar11 = local_40;
                    if (!bVar2) break;
                    pcVar17 = (char *)plVar13[5];
                    plVar13 = plVar13 + 5;
                  } while (pcVar17 != (char *)0x0);
                }
                puVar18 = local_c8;
                plVar4 = (long *)0xe;
                if (bVar7) {
                  if (plVar13[3] == 0) {
                    if (cVar16 != '=') goto LAB_00110bdd;
                    iVar3 = 2;
                  }
                  else {
                    if (cVar16 == '=') {
                      pcVar15 = pcVar15 + lVar20;
                      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                      sVar5 = strlen(pcVar15);
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_f0,pcVar15,pcVar15 + sVar5);
                      set<std::__cxx11::string>(local_d0,pcVar17,&local_f0,true);
                      puVar18 = local_c8;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f0._M_dataplus._M_p != &local_f0.field_2) goto LAB_00110b61;
                      goto LAB_00110bfc;
                    }
                    uVar9 = (int)uVar11 + 1;
                    iVar3 = 1;
                    if (uVar9 != uVar14) {
                      std::__cxx11::string::string
                                ((string *)&local_f0,(char *)local_c8[(int)uVar9],
                                 (allocator *)&local_b8);
                      set<std::__cxx11::string>(local_d0,pcVar17,&local_f0,true);
                      goto LAB_00110c44;
                    }
                  }
                }
                else {
                  iVar3 = 0;
                }
              }
            }
            else {
              pcVar17 = (char *)*local_c0;
              plVar4 = (long *)0xe;
              iVar3 = 0;
              if (pcVar17 != (char *)0x0) {
                cVar1 = (char)local_c0[1];
                plVar13 = local_c0;
                while (cVar1 != cVar16) {
                  pcVar17 = (char *)plVar13[5];
                  if (pcVar17 == (char *)0x0) goto LAB_00110c5f;
                  cVar1 = (char)plVar13[6];
                  plVar13 = plVar13 + 5;
                }
                if (plVar13[3] == 0) {
                  iVar3 = 2;
                  if (pcVar15[2] == '\0') {
LAB_00110bdd:
                    local_f0._M_dataplus._M_p._0_4_ = 1;
                    set<int>(local_d0,pcVar17,(int *)&local_f0,true);
                    goto LAB_00110bfc;
                  }
                }
                else if (pcVar15[2] == '\0') {
                  uVar9 = (int)uVar11 + 1;
                  iVar3 = 1;
                  if (uVar9 != uVar14) {
                    std::__cxx11::string::string
                              ((string *)&local_f0,(char *)puVar18[(int)uVar9],
                               (allocator *)&local_b8);
                    set<std::__cxx11::string>(local_d0,pcVar17,&local_f0,true);
LAB_00110c44:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                      operator_delete(local_f0._M_dataplus._M_p);
                    }
                    plVar4 = (long *)0x0;
                    uVar11 = (ulong)uVar9;
                    iVar3 = local_f8;
                  }
                }
                else {
                  pcVar15 = pcVar15 + 2;
                  local_f0._M_dataplus._M_p = (pointer)paVar12;
                  sVar5 = strlen(pcVar15);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_f0,pcVar15,pcVar15 + sVar5);
                  set<std::__cxx11::string>(local_d0,pcVar17,&local_f0,true);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f0._M_dataplus._M_p != paVar12) {
LAB_00110b61:
                    operator_delete(local_f0._M_dataplus._M_p);
                  }
LAB_00110bfc:
                  plVar4 = (long *)0x0;
                  iVar3 = local_f8;
                }
              }
            }
LAB_00110c5f:
            local_f8 = iVar3;
            if ((int)plVar4 != 0) {
              if ((int)plVar4 != 0xe) {
                return 1;
              }
              pwVar21 = &local_d0->what_;
              iVar10 = (int)uVar11;
              iVar3 = (int)pwVar21;
              if (local_f8 == 2) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar21,"`",1);
                pcVar15 = (char *)puVar18[iVar10];
                if (pcVar15 == (char *)0x0) {
                  std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)pwVar21 + -0x18));
                }
                else {
                  sVar5 = strlen(pcVar15);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pwVar21,pcVar15,sVar5);
                }
                pcVar15 = "` doesn\'t allow an argument";
                lVar20 = 0x1b;
              }
              else if (local_f8 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar21,"`",1);
                pcVar15 = (char *)puVar18[iVar10];
                if (pcVar15 == (char *)0x0) {
                  std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)pwVar21 + -0x18));
                }
                else {
                  sVar5 = strlen(pcVar15);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pwVar21,pcVar15,sVar5);
                }
                pcVar15 = "` requires an argument";
                lVar20 = 0x16;
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pwVar21,"unrecognized option `",0x15);
                pcVar15 = (char *)puVar18[iVar10];
                if (pcVar15 == (char *)0x0) {
                  std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)pwVar21 + -0x18));
                }
                else {
                  sVar5 = strlen(pcVar15);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pwVar21,pcVar15,sVar5);
                }
                pcVar15 = "`";
                lVar20 = 1;
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar21,pcVar15,lVar20);
              return 0;
            }
          }
        }
        else {
          std::__cxx11::string::string((string *)&local_f0,pcVar15,(allocator *)&local_b8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_50,&local_f0);
          plVar4 = extraout_RAX_01;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != paVar12) {
            operator_delete(local_f0._M_dataplus._M_p);
            plVar4 = extraout_RAX_02;
          }
        }
        uVar9 = (int)uVar11 + 1;
        uVar11 = (ulong)uVar9;
      } while ((int)uVar9 < (int)uVar14);
    }
  }
  return (int)CONCAT71((int7)((ulong)plVar4 >> 8),1);
}

Assistant:

bool Param::open(int argc, char **argv, const Option *opts) {
  int ind = 0;
  int _errno = 0;

#define GOTO_ERROR(n) {                         \
    _errno = n;                                 \
    goto ERROR; } while (0)

  if (argc <= 0) {
    system_name_ = "unknown";
    return true;  // this is not error
  }

  system_name_ = std::string(argv[0]);

  init_param(&help_, &version_, system_name_, opts);

  for (size_t i = 0; opts[i].name; ++i) {
    if (opts[i].default_value) set<std::string>
                                   (opts[i].name, opts[i].default_value);
  }

  for (ind = 1; ind < argc; ind++) {
    if (argv[ind][0] == '-') {
      // long options
      if (argv[ind][1] == '-') {
        char *s;
        for (s = &argv[ind][2]; *s != '\0' && *s != '='; s++);
        size_t len = (size_t)(s - &argv[ind][2]);
        if (len == 0) return true;  // stop the scanning

        bool hit = false;
        size_t i = 0;
        for (i = 0; opts[i].name; ++i) {
          size_t nlen = std::strlen(opts[i].name);
          if (nlen == len && std::strncmp(&argv[ind][2],
                                          opts[i].name, len) == 0) {
            hit = true;
            break;
          }
        }

        if (!hit) GOTO_ERROR(0);

        if (opts[i].arg_description) {
          if (*s == '=') {
            set<std::string>(opts[i].name, s+1);
          } else {
            if (argc == (ind+1)) GOTO_ERROR(1);
            set<std::string>(opts[i].name, argv[++ind]);
          }
        } else {
          if (*s == '=') GOTO_ERROR(2);
          set<int>(opts[i].name, 1);
        }

        // short options
      } else if (argv[ind][1] != '\0') {
        size_t i = 0;
        bool hit = false;
        for (i = 0; opts[i].name; ++i) {
          if (opts[i].short_name == argv[ind][1]) {
            hit = true;
            break;
          }
        }

        if (!hit) GOTO_ERROR(0);

        if (opts[i].arg_description) {
          if (argv[ind][2] != '\0') {
            set<std::string>(opts[i].name, &argv[ind][2]);
          } else {
            if (argc == (ind+1)) GOTO_ERROR(1);
            set<std::string>(opts[i].name, argv[++ind]);
          }
        } else {
          if (argv[ind][2] != '\0') GOTO_ERROR(2);
          set<int>(opts[i].name, 1);
        }
      }
    } else {
      rest_.push_back(std::string(argv[ind]));  // others
    }
  }

  return true;

ERROR:
  switch (_errno) {
    case 0: WHAT << "unrecognized option `" << argv[ind] << "`"; break;
    case 1: WHAT << "`" << argv[ind] << "` requires an argument";  break;
    case 2: WHAT << "`" << argv[ind] << "` doesn't allow an argument"; break;
  }
  return false;
}